

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O2

void duckdb::ValiditySelect
               (ColumnSegment *segment,ColumnScanState *state,idx_t param_3,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  pointer pSVar4;
  data_ptr_t pdVar5;
  idx_t iVar6;
  ulong uVar7;
  idx_t i;
  idx_t row_idx;
  ValidityMask source_mask;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __int_type local_38;
  
  Vector::Flatten(result,sel_count);
  pSVar4 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  pdVar5 = BufferHandle::Ptr((BufferHandle *)(pSVar4 + 1));
  iVar1 = segment->offset;
  FlatVector::VerifyFlatVector(result);
  iVar2 = state->row_index;
  iVar3 = (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  local_38 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
             super___atomic_base<unsigned_long>._M_i;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (row_idx = 0; sel_count != row_idx; row_idx = row_idx + 1) {
    iVar6 = row_idx;
    if (sel->sel_vector != (sel_t *)0x0) {
      iVar6 = (idx_t)sel->sel_vector[row_idx];
    }
    uVar7 = iVar6 + (iVar2 - iVar3);
    if ((*(ulong *)(pdVar5 + (uVar7 >> 6) * 8 + iVar1) >> (uVar7 & 0x3f) & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return;
}

Assistant:

void ValiditySelect(ColumnSegment &segment, ColumnScanState &state, idx_t, Vector &result, const SelectionVector &sel,
                    idx_t sel_count) {
	result.Flatten(sel_count);

	auto &scan_state = state.scan_state->Cast<ValidityScanState>();
	auto buffer_ptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto &result_mask = FlatVector::Validity(result);
	auto input_data = reinterpret_cast<validity_t *>(buffer_ptr);

	auto start = segment.GetRelativeIndex(state.row_index);
	ValidityMask source_mask(input_data, segment.count);
	for (idx_t i = 0; i < sel_count; i++) {
		auto source_idx = start + sel.get_index(i);
		if (!source_mask.RowIsValidUnsafe(source_idx)) {
			result_mask.SetInvalid(i);
		}
	}
}